

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

void av1_apply_temporal_filter_c
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  undefined4 uVar1;
  int ref_stride;
  uint8_t *ref_00;
  int block_height;
  int block_width;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint32_t *square_diff_00;
  uint32_t *luma_sse_sum_00;
  ulong uVar6;
  int in_ECX;
  int iVar7;
  byte in_DL;
  long in_RSI;
  YV12_BUFFER_CONFIG *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  uint8_t *in_stack_00000038;
  long in_stack_00000040;
  long in_stack_00000048;
  int pred_value;
  int idx;
  float fweight;
  int weight;
  double scaled_error;
  double combined_error;
  double block_error;
  int subblock_idx_1;
  double window_error;
  int x;
  int y;
  int wj;
  int wi;
  uint64_t sum_square_diff;
  int j;
  int i;
  int pred_idx;
  double inv_num_ref_pixels;
  int num_ref_pixels;
  int ss_x_shift;
  int ss_y_shift;
  uint8_t *ref;
  int frame_offset;
  int frame_stride;
  int w;
  int h;
  int subsampling_x;
  int subsampling_y;
  int plane_1;
  int plane_offset;
  int half_window;
  uint32_t *luma_sse_sum;
  uint32_t *square_diff;
  double distance_threshold;
  double distance;
  MV mv;
  int subblock_idx;
  double d_factor [4];
  double n_decay;
  int plane;
  double s_decay;
  double q_decay;
  double decay_factor [3];
  double weight_factor;
  double inv_factor;
  int min_frame_size;
  int frame_width;
  int frame_height;
  uint16_t *pred16;
  int is_high_bitdepth;
  int mb_pels;
  int mb_width;
  int mb_height;
  int in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  size_t in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  double local_200;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  double local_1d8;
  double local_1d0;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  int local_19c;
  int local_18c;
  int local_158;
  long lVar12;
  int local_144;
  int local_140;
  int local_13c;
  int local_fc;
  int local_f8;
  short local_d0;
  short sStack_ce;
  int local_cc;
  double local_c8 [4];
  double local_a8;
  int local_9c;
  double local_98;
  double local_90;
  double local_88 [4];
  undefined8 local_68;
  undefined8 local_60;
  int local_54;
  int local_50;
  int local_4c;
  long local_48;
  int local_40;
  int local_3c;
  uint local_38;
  uint local_34;
  int local_30;
  int local_2c;
  int local_28;
  long local_20;
  YV12_BUFFER_CONFIG *local_18;
  float local_c;
  
  local_34 = (uint)block_size_high[in_DL];
  local_38 = (uint)block_size_wide[in_DL];
  local_3c = local_34 * local_38;
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_ECX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_40 = is_frame_high_bitdepth(in_RDI);
  local_48 = (long)in_stack_00000038 << 1;
  local_4c = (local_18->field_3).field_0.y_crop_height;
  local_50 = (local_18->field_2).field_0.y_crop_width;
  local_19c = local_50;
  if (local_4c < local_50) {
    local_19c = local_4c;
  }
  local_54 = local_19c;
  local_60 = 0x3f81111111111111;
  local_68 = 0x3fa5555555555555;
  memset(local_88,0,0x18);
  local_1b0 = pow((double)in_stack_00000020 / 20.0,2.0);
  if (1e-05 <= local_1b0) {
    if (1.0 < local_1b0) {
      local_1b0 = 1.0;
    }
    local_1a8 = local_1b0;
  }
  else {
    local_1a8 = 1e-05;
  }
  local_90 = local_1a8;
  if (0x7f < in_stack_00000020) {
    local_90 = pow((double)in_stack_00000020 / 64.0,2.0);
    local_90 = local_90 * 0.5;
  }
  local_1c0 = pow((double)in_stack_00000028 / 4.0,2.0);
  if (1e-05 <= local_1c0) {
    if (1.0 < local_1c0) {
      local_1c0 = 1.0;
    }
    local_1b8 = local_1c0;
  }
  else {
    local_1b8 = 1e-05;
  }
  local_98 = local_1b8;
  for (local_9c = 0; local_9c < local_30; local_9c = local_9c + 1) {
    dVar9 = *(double *)(in_stack_00000008 + (long)local_9c * 8);
    local_a8 = log(dVar9 + dVar9 + 5.0);
    local_a8 = local_a8 + 0.5;
    local_88[local_9c] = 1.0 / (local_a8 * local_90 * local_98);
  }
  memset(local_c8,0,0x20);
  for (local_cc = 0; local_cc < 4; local_cc = local_cc + 1) {
    uVar1 = *(undefined4 *)(in_stack_00000010 + (long)local_cc * 4);
    local_d0 = (short)uVar1;
    dVar9 = pow((double)(int)local_d0,2.0);
    sStack_ce = (short)((uint)uVar1 >> 0x10);
    dVar10 = pow((double)(int)sStack_ce,2.0);
    dVar9 = sqrt(dVar9 + dVar10);
    local_1d0 = (double)local_54 * 0.1;
    if (local_1d0 <= 1.0) {
      local_1d0 = 1.0;
    }
    local_c8[local_cc] = dVar9 / local_1d0;
    if (local_c8[local_cc] <= 1.0) {
      local_1d8 = 1.0;
    }
    else {
      local_1d8 = local_c8[local_cc];
    }
    local_c8[local_cc] = local_1d8;
  }
  square_diff_00 =
       (uint32_t *)
       aom_memalign(CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                    in_stack_fffffffffffffdf0);
  if (square_diff_00 == (uint32_t *)0x0) {
    aom_internal_error(*(aom_internal_error_info **)(local_20 + 0x29f0),AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }
  memset(square_diff_00,0,(long)local_3c << 2);
  luma_sse_sum_00 =
       (uint32_t *)
       aom_memalign(CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                    in_stack_fffffffffffffdf0);
  if (luma_sse_sum_00 == (uint32_t *)0x0) {
    aom_free((void *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    aom_internal_error(*(aom_internal_error_info **)(local_20 + 0x29f0),AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }
  memset(luma_sse_sum_00,0,(long)local_3c << 2);
  local_f8 = 0;
  for (local_fc = 0; local_fc < local_30; local_fc = local_fc + 1) {
    iVar3 = *(int *)(local_20 + (long)local_fc * 0xa30 + 0x18);
    iVar4 = *(int *)(local_20 + (long)local_fc * 0xa30 + 0x14);
    block_height = (int)local_34 >> ((byte)iVar3 & 0x1f);
    block_width = (int)local_38 >> ((byte)iVar4 & 0x1f);
    ref_stride = *(int *)((long)local_18->store_buf_adr +
                         (long)(int)(uint)(local_fc != 0) * 4 + -0x28);
    iVar2 = local_28 * block_height;
    iVar7 = local_2c * block_width;
    ref_00 = local_18->store_buf_adr[(long)local_fc + -4];
    iVar3 = iVar3 - *(int *)(local_20 + 0x18);
    iVar4 = iVar4 - *(int *)(local_20 + 0x14);
    if (local_fc == 0) {
      local_1dc = 0;
    }
    else {
      local_1dc = 1 << ((char)iVar4 + (char)iVar3 & 0x1fU);
    }
    if (local_fc == 1) {
      compute_luma_sq_error_sum(square_diff_00,luma_sse_sum_00,block_height,block_width,iVar4,iVar3)
      ;
    }
    in_stack_fffffffffffffde0 = block_width;
    compute_square_diff(ref_00,iVar2 * ref_stride + iVar7,ref_stride,in_stack_00000038,local_f8,
                        block_width,block_height,block_width,local_40,square_diff_00);
    local_13c = 0;
    for (local_140 = 0; local_140 < block_height; local_140 = local_140 + 1) {
      for (local_144 = 0; local_144 < block_width; local_144 = local_144 + 1) {
        lVar12 = 0;
        for (iVar3 = -2; iVar3 < 3; iVar3 = iVar3 + 1) {
          for (local_158 = -2; local_158 < 3; local_158 = local_158 + 1) {
            if (local_140 + iVar3 < 0) {
              local_1e0 = 0;
            }
            else {
              if (block_height + -1 < local_140 + iVar3) {
                local_1e4 = block_height + -1;
              }
              else {
                local_1e4 = local_140 + iVar3;
              }
              local_1e0 = local_1e4;
            }
            if (local_144 + local_158 < 0) {
              local_1e8 = 0;
            }
            else {
              if (block_width + -1 < local_144 + local_158) {
                local_1ec = block_width + -1;
              }
              else {
                local_1ec = local_144 + local_158;
              }
              local_1e8 = local_1ec;
            }
            lVar12 = (ulong)square_diff_00[local_1e0 * block_width + local_1e8] + lVar12;
          }
        }
        uVar6 = (ulong)luma_sse_sum_00[local_140 * block_width + local_144] + lVar12;
        if (8 < *(int *)(local_20 + 0x29a0)) {
          uVar6 = uVar6 >> (((char)*(undefined4 *)(local_20 + 0x29a0) + -8) * '\x02' & 0x3fU);
        }
        auVar11._8_4_ = (int)(uVar6 >> 0x20);
        auVar11._0_8_ = uVar6;
        auVar11._12_4_ = 0x45300000;
        iVar3 = (uint)(block_height / 2 <= local_140) * 2 + (uint)(block_width / 2 <= local_144);
        local_200 = (((auVar11._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) *
                     (1.0 / (double)(local_1dc + 0x19)) * 0.041666666666666664 +
                    (double)*(int *)(in_stack_00000018 + (long)iVar3 * 4) * 0.008333333333333333) *
                    local_c8[iVar3] * local_88[local_fc];
        if (7.0 <= local_200) {
          local_200 = 7.0;
        }
        if (in_stack_00000030 == 0) {
          dVar9 = exp(-local_200);
          local_18c = (int)(dVar9 * 1000.0);
        }
        else {
          fVar8 = approx_exp((float)-local_200);
          local_c = fVar8 * 1000.0;
          local_18c = (int)(fVar8 * 1000.0 + 0.5);
        }
        iVar3 = local_f8 + local_13c;
        if (local_40 == 0) {
          uVar5 = (uint)in_stack_00000038[iVar3];
        }
        else {
          uVar5 = (uint)*(ushort *)(local_48 + (long)iVar3 * 2);
        }
        *(uint *)(in_stack_00000040 + (long)iVar3 * 4) =
             local_18c * uVar5 + *(int *)(in_stack_00000040 + (long)iVar3 * 4);
        *(short *)(in_stack_00000048 + (long)iVar3 * 2) =
             *(short *)(in_stack_00000048 + (long)iVar3 * 2) + (short)local_18c;
        local_13c = local_13c + 1;
      }
    }
    local_f8 = block_height * block_width + local_f8;
  }
  aom_free((void *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  aom_free((void *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  return;
}

Assistant:

void av1_apply_temporal_filter_c(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  // Block information.
  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int mb_pels = mb_height * mb_width;
  const int is_high_bitdepth = is_frame_high_bitdepth(frame_to_filter);
  const uint16_t *pred16 = CONVERT_TO_SHORTPTR(pred);
  // Frame information.
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Decay factors for non-local mean approach.
  double decay_factor[MAX_MB_PLANE] = { 0 };
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  for (int plane = 0; plane < num_planes; plane++) {
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    decay_factor[plane] = 1 / (n_decay * q_decay * s_decay);
  }
  double d_factor[4] = { 0 };
  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Allocate memory for pixel-wise squared differences. They,
  // regardless of the subsampling, are assigned with memory of size `mb_pels`.
  uint32_t *square_diff = aom_memalign(16, mb_pels * sizeof(uint32_t));
  if (!square_diff) {
    aom_internal_error(mbd->error_info, AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }
  memset(square_diff, 0, mb_pels * sizeof(square_diff[0]));

  // Allocate memory for accumulated luma squared error. This value will be
  // consumed while filtering the chroma planes.
  uint32_t *luma_sse_sum = aom_memalign(32, mb_pels * sizeof(uint32_t));
  if (!luma_sse_sum) {
    aom_free(square_diff);
    aom_internal_error(mbd->error_info, AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }
  memset(luma_sse_sum, 0, mb_pels * sizeof(luma_sse_sum[0]));

  // Get window size for pixel-wise filtering.
  assert(TF_WINDOW_LENGTH % 2 == 1);
  const int half_window = TF_WINDOW_LENGTH >> 1;

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    // Locate pixel on reference frame.
    const int subsampling_y = mbd->plane[plane].subsampling_y;
    const int subsampling_x = mbd->plane[plane].subsampling_x;
    const int h = mb_height >> subsampling_y;  // Plane height.
    const int w = mb_width >> subsampling_x;   // Plane width.
    const int frame_stride =
        frame_to_filter->strides[plane == AOM_PLANE_Y ? 0 : 1];
    const int frame_offset = mb_row * h * frame_stride + mb_col * w;
    const uint8_t *ref = frame_to_filter->buffers[plane];
    const int ss_y_shift =
        subsampling_y - mbd->plane[AOM_PLANE_Y].subsampling_y;
    const int ss_x_shift =
        subsampling_x - mbd->plane[AOM_PLANE_Y].subsampling_x;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane will
    // be more accurate. The luma sse sum is reused in both chroma planes.
    if (plane == AOM_PLANE_U)
      compute_luma_sq_error_sum(square_diff, luma_sse_sum, h, w, ss_x_shift,
                                ss_y_shift);
    compute_square_diff(ref, frame_offset, frame_stride, pred, plane_offset, w,
                        h, w, is_high_bitdepth, square_diff);

    // Perform filtering.
    int pred_idx = 0;
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        // non-local mean approach
        uint64_t sum_square_diff = 0;

        for (int wi = -half_window; wi <= half_window; ++wi) {
          for (int wj = -half_window; wj <= half_window; ++wj) {
            const int y = CLIP(i + wi, 0, h - 1);  // Y-coord on current plane.
            const int x = CLIP(j + wj, 0, w - 1);  // X-coord on current plane.
            sum_square_diff += square_diff[y * w + x];
          }
        }

        sum_square_diff += luma_sse_sum[i * w + j];

        // Scale down the difference for high bit depth input.
        if (mbd->bd > 8) sum_square_diff >>= ((mbd->bd - 8) * 2);

        // Combine window error and block error, and normalize it.
        const double window_error = sum_square_diff * inv_num_ref_pixels;
        const int subblock_idx = (i >= h / 2) * 2 + (j >= w / 2);
        const double block_error = (double)subblock_mses[subblock_idx];
        const double combined_error =
            weight_factor * window_error + block_error * inv_factor;

        // Compute filter weight.
        double scaled_error =
            combined_error * d_factor[subblock_idx] * decay_factor[plane];
        scaled_error = AOMMIN(scaled_error, 7);
        int weight;
        if (tf_wgt_calc_lvl == 0) {
          weight = (int)(exp(-scaled_error) * TF_WEIGHT_SCALE);
        } else {
          const float fweight =
              approx_exp((float)-scaled_error) * TF_WEIGHT_SCALE;
          weight = iroundpf(fweight);
        }

        const int idx = plane_offset + pred_idx;  // Index with plane shift.
        const int pred_value = is_high_bitdepth ? pred16[idx] : pred[idx];
        accum[idx] += weight * pred_value;
        count[idx] += weight;

        ++pred_idx;
      }
    }
    plane_offset += h * w;
  }

  aom_free(square_diff);
  aom_free(luma_sse_sum);
}